

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowLevelIoExamples.cpp
# Opt level: O2

void lowLevelIoExamples(void)

{
  ostream *poVar1;
  FILE *pFVar2;
  int h;
  int w;
  Array2D<Imf_3_2::Rgba> p;
  stringstream _iex_throw_errno_s;
  int local_1d0 [2];
  string local_1c8 [32];
  Array2D<Imf_3_2::Rgba> local_1a8;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nCustom low-level file I/O\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"drawing image");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_1d0[1] = 800;
  local_1d0[0] = 600;
  local_1a8._sizeX = 600;
  local_1a8._sizeY = 800;
  local_1a8._data = (Rgba *)operator_new__(0x3a9800);
  drawImage1(&local_1a8,800,600);
  poVar1 = std::operator<<((ostream *)&std::cout,"writing image");
  std::endl<char,std::char_traits<char>>(poVar1);
  pFVar2 = fopen("rgba4.exr","wb");
  if (pFVar2 == (FILE *)0x0) {
    std::__cxx11::stringstream::stringstream(local_190);
    poVar1 = std::operator<<(local_180,"Cannot open file ");
    poVar1 = std::operator<<(poVar1,"rgba4.exr");
    std::operator<<(poVar1," (%T).");
    std::__cxx11::stringbuf::str();
    Iex_3_2::throwErrnoExc(local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::stringstream::~stringstream(local_190);
  }
  else {
    writeRgbaFILE((FILE *)pFVar2,"rgba4.exr",local_1a8._data,800,600);
    fclose(pFVar2);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"reading image");
  std::endl<char,std::char_traits<char>>(poVar1);
  pFVar2 = fopen("rgba4.exr","rb");
  if (pFVar2 == (FILE *)0x0) {
    std::__cxx11::stringstream::stringstream(local_190);
    poVar1 = std::operator<<(local_180,"Cannot open file ");
    poVar1 = std::operator<<(poVar1,"rgba4.exr");
    std::operator<<(poVar1," (%T).");
    std::__cxx11::stringbuf::str();
    Iex_3_2::throwErrnoExc(local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::stringstream::~stringstream(local_190);
  }
  else {
    readRgbaFILE((FILE *)pFVar2,"rgba4.exr",&local_1a8,local_1d0 + 1,local_1d0);
    fclose(pFVar2);
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&local_1a8);
  return;
}

Assistant:

void
lowLevelIoExamples ()
{
    cout << "\nCustom low-level file I/O\n" << endl;
    cout << "drawing image" << endl;

    int         w        = 800;
    int         h        = 600;
    const char* fileName = "rgba4.exr";

    Array2D<Rgba> p (h, w);
    drawImage1 (p, w, h);

    //
    // The following code is somewhat complicated because
    // fopen() returns 0 on error, but writeRgbaFILE() and
    // readRgbaFILE() throw exceptions.  Also, if a FILE *
    // goes out of scope, the corresponding file is not
    // automatically closed.  In order to avoid leaking
    // file descriptors, we have to make sure fclose() is
    // called in all cases.
    //

    cout << "writing image" << endl;

    {
        FILE* file = fopen (fileName, "wb");

        if (file == 0)
        {
            THROW_ERRNO ("Cannot open file " << fileName << " (%T).");
        }
        else
        {
            try
            {
                writeRgbaFILE (file, fileName, &p[0][0], w, h);
            }
            catch (...)
            {
                fclose (file);
                throw;
            }

            fclose (file);
        }
    }

    cout << "reading image" << endl;

    {
        FILE* file = fopen (fileName, "rb");

        if (file == 0)
        {
            THROW_ERRNO ("Cannot open file " << fileName << " (%T).");
        }
        else
        {
            try
            {
                readRgbaFILE (file, fileName, p, w, h);
            }
            catch (...)
            {
                fclose (file);
                throw;
            }

            fclose (file);
        }
    }
}